

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O0

arg_t * SEM_Args(ast *node)

{
  ast *node_00;
  attr *paVar1;
  ast *paVar2;
  arg_t *paVar3;
  ast *in_RDI;
  ast *child3;
  arg_t *a;
  ast *in_stack_00000058;
  
  node_00 = (ast *)malloc(0x10);
  child(in_RDI,1);
  paVar1 = SEM_Exp(in_stack_00000058);
  *(attr **)node_00 = paVar1;
  paVar2 = child(in_RDI,3);
  if (paVar2 == (ast *)0x0) {
    node_00->name = (char *)0x0;
  }
  else {
    paVar3 = SEM_Args(node_00);
    node_00->name = (char *)paVar3;
  }
  return (arg_t *)node_00;
}

Assistant:

struct arg_t *SEM_Args(struct ast *node) {
    struct arg_t *a = malloc(sizeof(struct arg_t));
    a->arg = SEM_Exp(child(node, 1));
    struct ast *child3 = child(node, 3);
    if (child3)
        a->next = SEM_Args(child3);
    else
        a->next = NULL;
    return a;
}